

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_element.cpp
# Opt level: O2

string * __thiscall ICM::to_string_abi_cxx11_(string *__return_storage_ptr__,ICM *this,AST *ast)

{
  undefined8 *puVar1;
  Node *node;
  undefined8 *puVar2;
  string sStack_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"{AST:",(allocator *)&sStack_48);
  puVar1 = *(undefined8 **)(this + 8);
  if ((long)puVar1 - *(long *)this == 8) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    puVar2 = (undefined8 *)(*(long *)this + 8);
    if (puVar1 <= puVar2) {
      puVar2 = puVar1;
    }
    for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_string_abi_cxx11_(&sStack_48,(ICM *)*puVar2,node);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string to_string(const AST &ast) {
		string str("{AST:");
		if (ast.empty())
			str.append("NIL");
		else {
			for (const auto &e : ast.getTableRange()) {
				str.append("\n ");
				str.append(ICM::to_string(*e));
			}
		}
		str.append("\n}");
		return str;
	}